

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::normalizedPath(String *this,char sep,bool includeLastSep)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  uchar *extraout_RDX;
  undefined7 in_register_00000031;
  long lVar7;
  byte bVar8;
  String SVar9;
  String local_30;
  uchar *puVar6;
  
  lVar7 = CONCAT71(in_register_00000031,sep);
  uVar2 = *(uint *)(lVar7 + 4);
  uVar5 = (ulong)uVar2;
  uVar3 = uVar2 + 1;
  do {
    uVar4 = (int)uVar2 >> 0x1f & uVar2;
    if ((int)uVar5 < 1) break;
    pbVar1 = (byte *)(*(long *)(lVar7 + 8) + -1 + uVar5);
    uVar5 = uVar5 - 1;
    uVar3 = uVar3 - 1;
    uVar4 = uVar3;
  } while ((uint)*pbVar1 == (uint)CONCAT71(in_register_00000011,includeLastSep));
  bVar8 = (int)uVar4 < 1 | in_CL;
  if (bVar8 == 1) {
    midString(&local_30,(int)lVar7,0);
    SVar9 = operator+(this,(char)&local_30);
    puVar6 = SVar9.super_tagbstring.data;
  }
  else {
    SVar9 = midString(this,(int)lVar7,0);
    puVar6 = SVar9.super_tagbstring.data;
  }
  if ((bVar8 != 0) && (local_30.super_tagbstring.data != (uchar *)0x0)) {
    free(local_30.super_tagbstring.data);
    puVar6 = extraout_RDX;
  }
  SVar9.super_tagbstring.data = puVar6;
  SVar9.super_tagbstring._0_8_ = this;
  return (String)SVar9.super_tagbstring;
}

Assistant:

String String::normalizedPath(char sep, const bool includeLastSep) const
    {
        int rightLimit = slen - 1;
        while (rightLimit >= 0 && data[rightLimit] == sep) rightLimit--;
        return includeLastSep || rightLimit < 0 ? midString(0, rightLimit+1) + sep : midString(0, rightLimit+1);
    }